

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,unsigned_long,duckdb::UnaryLambdaWrapper,unsigned_long(*)(duckdb::string_t_const&)>
               (string_t *ldata,unsigned_long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  unsigned_long *puVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  idx_t iVar8;
  char **ppcVar9;
  ulong uVar10;
  _func_unsigned_long_string_t_ptr **fun;
  ulong uVar11;
  ulong uVar12;
  char **local_88;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  ValidityMask *local_60;
  unsigned_long *local_58;
  ulong local_50;
  undefined8 *local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_88 = &(ldata->value).pointer.ptr;
      iVar8 = 0;
      do {
        local_78 = *(element_type **)(local_88 + -1);
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_88;
        uVar6 = (**dataptr)(&local_78);
        result_data[iVar8] = uVar6;
        iVar8 = iVar8 + 1;
        local_88 = local_88 + 2;
      } while (count != iVar8);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_70;
      peVar2 = local_78;
      local_78 = (element_type *)0x0;
      p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_50 = count + 0x3f >> 6;
      local_40 = 0;
      uVar12 = 0;
      local_58 = result_data;
      local_48 = (undefined8 *)dataptr;
      do {
        puVar4 = local_58;
        puVar1 = (local_60->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar1[local_40];
        }
        uVar10 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar10 = count;
        }
        uVar11 = uVar10;
        if (uVar6 != 0) {
          uVar11 = uVar12;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar12 < uVar10) {
              ppcVar9 = &ldata[uVar12].value.pointer.ptr;
              do {
                local_78 = *(element_type **)(ppcVar9 + -1);
                p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar9;
                uVar6 = (**dataptr)(&local_78);
                puVar4[uVar12] = uVar6;
                uVar12 = uVar12 + 1;
                ppcVar9 = ppcVar9 + 2;
                uVar11 = uVar12;
              } while (uVar10 != uVar12);
            }
          }
          else if (uVar12 < uVar10) {
            ppcVar9 = &ldata[uVar12].value.pointer.ptr;
            uVar11 = 0;
            do {
              if ((uVar6 >> (uVar11 & 0x3f) & 1) != 0) {
                local_78 = *(element_type **)(ppcVar9 + -1);
                p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppcVar9;
                uVar7 = (*(code *)*local_48)(&local_78);
                puVar4[uVar12 + uVar11] = uVar7;
              }
              uVar11 = uVar11 + 1;
              ppcVar9 = ppcVar9 + 2;
            } while ((uVar12 - uVar10) + uVar11 != 0);
            dataptr = local_48;
            uVar11 = uVar12 + uVar11;
          }
        }
        local_40 = local_40 + 1;
        uVar12 = uVar11;
      } while (local_40 != local_50);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}